

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<char>_>::decrement
          (segment_index_iterator<std::_List_iterator<char>_> *this)

{
  element_type *peVar1;
  long lVar2;
  ulong uVar3;
  uint *puVar4;
  long lVar5;
  bool bVar6;
  pair<unsigned_long,_unsigned_long> pos;
  pair<unsigned_long,_unsigned_long> pos_00;
  
  uVar3 = (this->current_).second;
  if (this->full_select_ != true) {
    if (1 < uVar3) {
      peVar1 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar5 = (long)(peVar1->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (uint *)(lVar5 + uVar3 * 0x10 + -8);
      do {
        bVar6 = true;
        if (((long)(peVar1->
                   super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish - lVar5 >> 4) + 1U != uVar3) {
          bVar6 = (*puVar4 & this->mask_) != 0;
        }
        uVar3 = uVar3 - 1;
      } while ((1 < uVar3) && (puVar4 = puVar4 + -4, !bVar6));
    }
    pos_00.second = uVar3;
    pos_00.first = uVar3 - 1;
    update_current(this,pos_00);
    return;
  }
  if (1 < uVar3) {
    peVar1 = (this->map_->index_).
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar5 = (long)(peVar1->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (uint *)(lVar5 + uVar3 * 0x10 + -8);
    do {
      bVar6 = true;
      if (((long)(peVar1->
                 super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 )._M_impl.super__Vector_impl_data._M_finish - lVar5 >> 4) + 1U != uVar3) {
        bVar6 = (*puVar4 & this->mask_) != 0;
      }
      uVar3 = uVar3 - 1;
    } while ((1 < uVar3) && (puVar4 = puVar4 + -4, !bVar6));
  }
  if (uVar3 != 0) {
    lVar5 = uVar3 * 0x10 + -8;
    pos.first = uVar3;
    do {
      pos.first = pos.first - 1;
      bVar6 = true;
      if ((pos.first != 0) &&
         (peVar1 = (this->map_->index_).
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,
         lVar2 = (long)(peVar1->
                       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                       )._M_impl.super__Vector_impl_data._M_start,
         pos.first !=
         (long)(peVar1->
               super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               )._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4)) {
        bVar6 = (*(uint *)(lVar2 + lVar5) & this->mask_) != 0;
      }
    } while ((pos.first != 0) && (lVar5 = lVar5 + -0x10, !bVar6));
    pos.second = uVar3;
    update_current(this,pos);
    return;
  }
  update_current(this,(pair<unsigned_long,_unsigned_long>)ZEXT816(0));
  return;
}

Assistant:

void decrement()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second;
                            while(next.first >0) {
                                next.first--;
                                if(valid_offset(next.first))
                                    break;
                            }
                        }
                        else {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second - 1;
                        }
                        update_current(next);
                    }